

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYRef<unsigned_int>,_ImPlot::TransformerLinLin>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYRef<unsigned_int>,_ImPlot::TransformerLinLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  int iVar5;
  int iVar6;
  ImU32 IVar7;
  uint uVar8;
  GetterXsYs<unsigned_int> *pGVar9;
  GetterXsYRef<unsigned_int> *pGVar10;
  ImDrawVert *pIVar11;
  ImDrawIdx *pIVar12;
  double dVar13;
  ImDrawIdx IVar14;
  long lVar15;
  bool bVar16;
  float fVar17;
  double dVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  
  pGVar9 = this->Getter1;
  pGVar10 = this->Getter2;
  iVar5 = pGVar9->Count;
  lVar15 = (long)(((pGVar9->Offset + prim) % iVar5 + iVar5) % iVar5) * (long)pGVar9->Stride;
  iVar5 = this->Transformer->YAxis;
  dVar18 = (double)GImPlot->PixelRange[iVar5].Min.x;
  dVar2 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  fVar23 = (float)(((double)*(uint *)((long)pGVar9->Xs + lVar15) - dVar2) * GImPlot->Mx + dVar18);
  dVar13 = (double)GImPlot->PixelRange[iVar5].Min.y;
  dVar3 = GImPlot->CurrentPlot->YAxis[iVar5].Range.Min;
  fVar24 = (float)(((double)*(uint *)((long)pGVar9->Ys + lVar15) - dVar3) * GImPlot->My[iVar5] +
                  dVar13);
  iVar6 = pGVar10->Count;
  fVar20 = (float)(((double)*(uint *)((long)pGVar10->Xs +
                                     (long)(((prim + pGVar10->Offset) % iVar6 + iVar6) % iVar6) *
                                     (long)pGVar10->Stride) - dVar2) * GImPlot->Mx + dVar18);
  fVar19 = (float)((pGVar10->YRef - dVar3) * GImPlot->My[iVar5] + dVar13);
  fVar22 = fVar24;
  if (fVar19 <= fVar24) {
    fVar22 = fVar19;
  }
  bVar16 = false;
  if ((fVar22 < (cull_rect->Max).y) &&
     (fVar22 = (float)(~-(uint)(fVar19 <= fVar24) & (uint)fVar19 |
                      -(uint)(fVar19 <= fVar24) & (uint)fVar24), pfVar1 = &(cull_rect->Min).y,
     bVar16 = false, *pfVar1 <= fVar22 && fVar22 != *pfVar1)) {
    fVar22 = fVar23;
    if (fVar20 <= fVar23) {
      fVar22 = fVar20;
    }
    if (fVar22 < (cull_rect->Max).x) {
      fVar22 = (float)(~-(uint)(fVar20 <= fVar23) & (uint)fVar20 |
                      -(uint)(fVar20 <= fVar23) & (uint)fVar23);
      bVar16 = (cull_rect->Min).x <= fVar22 && fVar22 != (cull_rect->Min).x;
    }
  }
  if (bVar16 != false) {
    fVar22 = this->Weight;
    IVar7 = this->Col;
    IVar4 = *uv;
    fVar21 = fVar20 - fVar23;
    fVar25 = fVar19 - fVar24;
    fVar17 = fVar21 * fVar21 + fVar25 * fVar25;
    if (0.0 < fVar17) {
      if (fVar17 < 0.0) {
        fVar17 = sqrtf(fVar17);
      }
      else {
        fVar17 = SQRT(fVar17);
      }
      fVar21 = fVar21 * (1.0 / fVar17);
      fVar25 = fVar25 * (1.0 / fVar17);
    }
    fVar22 = fVar22 * 0.5;
    fVar21 = fVar21 * fVar22;
    fVar22 = fVar22 * fVar25;
    pIVar11 = DrawList->_VtxWritePtr;
    (pIVar11->pos).x = fVar22 + fVar23;
    (pIVar11->pos).y = fVar24 - fVar21;
    pIVar11->uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->col = IVar7;
    pIVar11[1].pos.x = fVar22 + fVar20;
    pIVar11[1].pos.y = fVar19 - fVar21;
    pIVar11[1].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[1].col = IVar7;
    pIVar11[2].pos.x = fVar20 - fVar22;
    pIVar11[2].pos.y = fVar21 + fVar19;
    pIVar11[2].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[2].col = IVar7;
    pIVar11[3].pos.x = fVar23 - fVar22;
    pIVar11[3].pos.y = fVar21 + fVar24;
    pIVar11[3].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[3].col = IVar7;
    DrawList->_VtxWritePtr = pIVar11 + 4;
    uVar8 = DrawList->_VtxCurrentIdx;
    pIVar12 = DrawList->_IdxWritePtr;
    IVar14 = (ImDrawIdx)uVar8;
    *pIVar12 = IVar14;
    pIVar12[1] = IVar14 + 1;
    pIVar12[2] = IVar14 + 2;
    pIVar12[3] = IVar14;
    pIVar12[4] = IVar14 + 2;
    pIVar12[5] = IVar14 + 3;
    DrawList->_IdxWritePtr = pIVar12 + 6;
    DrawList->_VtxCurrentIdx = uVar8 + 4;
  }
  return bVar16;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }